

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_buffer_test.cpp
# Opt level: O1

void __thiscall
bidfx_public_api::tools::ByteBufferTest_test_read_write_short_Test::TestBody
          (ByteBufferTest_test_read_write_short_Test *this)

{
  bool bVar1;
  undefined2 uVar2;
  char *pcVar3;
  int16_t short2;
  int16_t short1;
  AssertionResult gtest_ar_1;
  ByteBuffer byte_buffer2;
  ByteBuffer byte_buffer1;
  short local_8c [2];
  AssertHelper local_88;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  AssertHelper local_70;
  internal local_68 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60 [5];
  ByteBuffer local_38 [48];
  
  local_8c[1] = 0x236;
  bidfx_public_api::tools::ByteBuffer::ByteBuffer(local_38,2);
  bidfx_public_api::tools::ByteBuffer::WriteShort((short)local_38);
  uVar2 = bidfx_public_api::tools::ByteBuffer::ReadShort();
  local_80.ptr_._0_2_ = uVar2;
  testing::internal::CmpHelperEQ<short,short>
            (local_68,"short1","byte_buffer1.ReadShort()",local_8c + 1,(short *)&local_80);
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_80);
    if (local_60[0].ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       ) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_60[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/byte_buffer_test.cpp"
               ,0x97,pcVar3);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if (local_80.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_80.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_80.ptr_ + 8))();
      }
      local_80.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(local_60,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_8c[0] = -0x1b1;
  bidfx_public_api::tools::ByteBuffer::ByteBuffer((ByteBuffer *)local_68,2);
  bidfx_public_api::tools::ByteBuffer::WriteShort((short)local_68);
  uVar2 = bidfx_public_api::tools::ByteBuffer::ReadShort();
  local_88.data_._0_2_ = uVar2;
  testing::internal::CmpHelperEQ<short,short>
            ((internal *)&local_80,"short2","byte_buffer2.ReadShort()",local_8c,(short *)&local_88);
  if (local_80.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_88);
    if (local_78.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_78.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/byte_buffer_test.cpp"
               ,0x9c,pcVar3);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_88.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_88.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_88.data_ + 8))();
      }
      local_88.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bidfx_public_api::tools::ByteBuffer::~ByteBuffer((ByteBuffer *)local_68);
  bidfx_public_api::tools::ByteBuffer::~ByteBuffer(local_38);
  return;
}

Assistant:

TEST(ByteBufferTest, test_read_write_short)
{
    int16_t short1 = 566;
    ByteBuffer byte_buffer1(2);
    byte_buffer1.WriteShort(short1);
    EXPECT_EQ(short1, byte_buffer1.ReadShort());

    int16_t short2 = -433;
    ByteBuffer byte_buffer2(2);
    byte_buffer2.WriteShort(short2);
    EXPECT_EQ(short2, byte_buffer2.ReadShort());
}